

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSat.c
# Opt level: O2

Abc_Cex_t * Cec2_ManDeriveCex(Gia_Man_t *p,int iOut,int iPat)

{
  int iObj;
  Abc_Cex_t *pAVar1;
  Gia_Obj_t *pObj;
  word *pwVar2;
  uint v;
  
  v = 0;
  pAVar1 = Abc_CexAlloc(0,p->vCis->nSize,1);
  pAVar1->iPo = iOut;
  if (iPat != -1) {
    for (; (int)v < p->vCis->nSize; v = v + 1) {
      pObj = Gia_ManCi(p,v);
      iObj = Gia_ObjId(p,pObj);
      if (iObj == 0) {
        return pAVar1;
      }
      pwVar2 = Cec2_ObjSim(p,iObj);
      if ((*(uint *)((long)pwVar2 + (long)(iPat >> 5) * 4) & 1 << ((byte)iPat & 0x1f)) != 0) {
        (&pAVar1[1].iPo)[v >> 5] = (&pAVar1[1].iPo)[v >> 5] | 1 << ((byte)v & 0x1f);
      }
    }
  }
  return pAVar1;
}

Assistant:

Abc_Cex_t * Cec2_ManDeriveCex( Gia_Man_t * p, int iOut, int iPat )
{
    Abc_Cex_t * pCex;
    int i, Id;
    pCex = Abc_CexAlloc( 0, Gia_ManCiNum(p), 1 );
    pCex->iPo = iOut;
    if ( iPat == -1 )
        return pCex;
    Gia_ManForEachCiId( p, Id, i )
        if ( Abc_InfoHasBit((unsigned *)Cec2_ObjSim(p, Id), iPat) )
            Abc_InfoSetBit( pCex->pData, i );
    return pCex;
}